

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O3

Abc_Des_t * Io_MvParse(Io_MvMan_t *p)

{
  byte bVar1;
  undefined4 uVar2;
  Io_MvMod_t *p_00;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Str_t *pVVar5;
  Abc_Ntk_t *pAVar6;
  long *plVar7;
  Abc_Des_t *pAVar8;
  Io_MvMan_t *pIVar9;
  size_t __size;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  undefined4 extraout_var;
  Abc_Obj_t *pAVar17;
  ulong uVar18;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar19;
  size_t sVar20;
  Mio_Gate_t *pMVar21;
  Mio_Library_t *pMVar22;
  Mio_Gate_t *pMVar23;
  Abc_Ntk_t *pAVar24;
  Abc_Obj_t *pAVar25;
  Abc_Obj_t *pAVar26;
  Vec_Ptr_t *pVVar27;
  uint *puVar28;
  void *pvVar29;
  void **ppvVar30;
  char cVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  byte *pbVar35;
  byte *__s;
  long lVar36;
  long lVar37;
  ulong uVar38;
  Mem_Flex_t *pMVar39;
  long lVar40;
  char *pcVar41;
  long lVar42;
  int Counter;
  char **pNamesIn;
  char *pcVar43;
  uint uVar44;
  double dVar45;
  
  pVVar27 = p->vModels;
  if (0 < pVVar27->nSize) {
    lVar37 = 0;
    do {
      p_00 = (Io_MvMod_t *)pVVar27->pArray[lVar37];
      if (0 < p_00->vMvs->nSize) {
        Abc_NtkStartMvVars(p_00->pNtk);
        pVVar27 = p_00->vMvs;
        if (0 < pVVar27->nSize) {
          lVar42 = 0;
          do {
            pcVar41 = (char *)pVVar27->pArray[lVar42];
            cVar31 = *pcVar41;
            if (cVar31 == '\0') {
              uVar18 = 0;
            }
            else {
              uVar18 = 0;
              pcVar16 = pcVar41;
              do {
                pcVar16 = pcVar16 + 1;
                uVar18 = (ulong)((int)uVar18 + (uint)(cVar31 == ','));
                cVar31 = *pcVar16;
              } while (cVar31 != '\0');
            }
            pVVar27 = p_00->pMan->vTokens;
            Io_MvSplitIntoTokensAndClear(pVVar27,pcVar41,',','\0');
            uVar13 = pVVar27->nSize;
            if ((int)uVar13 < 1) goto LAB_002d1423;
            pcVar41 = (char *)*pVVar27->pArray;
            if (((*pcVar41 != 'm') || (pcVar41[1] != 'v')) || (pcVar41[2] != '\0')) {
              __assert_fail("!strcmp(pName, \"mv\")",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x611,"int Io_MvParseLineMv(Io_MvMod_t *, char *)");
            }
            iVar11 = (int)uVar18;
            if ((int)uVar13 <= (int)(iVar11 + 2U)) {
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d0d4f;
              uVar33 = 0;
              goto LAB_002d0c4e;
            }
            if (iVar11 < -2) goto LAB_002d1423;
            uVar10 = atoi((char *)pVVar27->pArray[iVar11 + 2U]);
            if (uVar10 - 0x101 < 0xffffff01) {
              pIVar9 = p_00->pMan;
              uVar18 = (ulong)pIVar9->vLines->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d0db1;
              uVar33 = 0;
              goto LAB_002d0c94;
            }
            uVar32 = iVar11 + 3;
            if ((uVar10 != 2) || (uVar13 != uVar32)) {
              uVar44 = uVar13 - uVar32;
              if ((uVar32 <= uVar13 && uVar44 != 0) && (uVar44 != uVar10)) {
                pIVar9 = p_00->pMan;
                uVar18 = (ulong)pIVar9->vLines->nSize;
                uVar38 = 0xffffffff;
                if ((long)uVar18 < 1) goto LAB_002d0e12;
                uVar33 = 0;
                goto LAB_002d0d31;
              }
              pVVar4 = p_00->pNtk->vAttrs;
              if (pVVar4->nSize < 0xd) goto LAB_002d1423;
              pvVar29 = pVVar4->pArray[0xc];
              if (pvVar29 == (void *)0x0) {
                pMVar39 = (Mem_Flex_t *)0x0;
              }
              else {
                pMVar39 = *(Mem_Flex_t **)((long)pvVar29 + 0x10);
              }
              uVar38 = 0;
              do {
                uVar38 = uVar38 + 1;
                if ((long)pVVar27->nSize <= (long)uVar38) goto LAB_002d1423;
                pAVar17 = Abc_NtkFindOrCreateNet(p_00->pNtk,(char *)pVVar27->pArray[uVar38]);
                puVar28 = (uint *)Mem_FlexEntryFetch(pMVar39,0x10);
                *puVar28 = uVar10;
                puVar28[2] = 0;
                puVar28[3] = 0;
                if ((int)uVar32 < pVVar27->nSize) {
                  pcVar41 = Mem_FlexEntryFetch(pMVar39,uVar10 * 8);
                  *(char **)(puVar28 + 2) = pcVar41;
                  if ((int)uVar32 < pVVar27->nSize) {
                    lVar40 = 0;
                    do {
                      pcVar41 = (char *)pVVar27->pArray[uVar18 + lVar40 + 3];
                      sVar20 = strlen(pcVar41);
                      pcVar16 = Mem_FlexEntryFetch(pMVar39,(int)sVar20 + 1);
                      *(char **)(*(long *)(puVar28 + 2) + lVar40 * 8) = pcVar16;
                      strcpy(*(char **)(*(long *)(puVar28 + 2) + lVar40 * 8),pcVar41);
                      lVar36 = (ulong)uVar32 + lVar40;
                      lVar40 = lVar40 + 1;
                    } while (lVar36 + 1 < (long)pVVar27->nSize);
                  }
                }
                pVVar4 = pAVar17->pNtk->vAttrs;
                if (pVVar4->nSize < 0xd) goto LAB_002d1423;
                piVar3 = (int *)pVVar4->pArray[0xc];
                pvVar29 = *(void **)(piVar3 + 2);
                if (pvVar29 == (void *)0x0) {
                  __assert_fail("p->pArrayPtr",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                                ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
                }
                if (*(long *)(piVar3 + 8) != 0) {
                  __assert_fail("p->pFuncStartObj == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                                ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
                }
                iVar12 = pAVar17->Id;
                iVar14 = *piVar3;
                if (iVar14 <= iVar12) {
                  iVar15 = iVar12 + 10;
                  if (iVar12 < iVar14 * 2) {
                    iVar15 = iVar14 * 2;
                  }
                  if (iVar14 < iVar15) {
                    pvVar29 = realloc(pvVar29,(long)iVar15 * 8);
                    *(void **)(piVar3 + 2) = pvVar29;
                    memset((void *)((long)pvVar29 + (long)*piVar3 * 8),0,
                           ((long)iVar15 - (long)*piVar3) * 8);
                    *piVar3 = iVar15;
                  }
                }
                *(uint **)((long)pvVar29 + (long)iVar12 * 8) = puVar28;
              } while (uVar38 != iVar11 + 1);
              if ((0 < (int)uVar10) && (lVar40 = *(long *)(puVar28 + 2), lVar40 != 0)) {
                uVar18 = (ulong)uVar10;
                lVar36 = lVar40;
                uVar38 = uVar18;
                uVar33 = 0;
                do {
                  uVar34 = uVar33 + 1;
                  if (uVar34 < uVar18) {
                    pcVar41 = *(char **)(lVar40 + uVar33 * 8);
                    uVar33 = 1;
                    do {
                      iVar11 = strcmp(pcVar41,*(char **)(lVar36 + uVar33 * 8));
                      if (iVar11 == 0) {
                        if (pVVar27->nSize < 1) goto LAB_002d1423;
                        pVVar4 = p_00->pMan->vLines;
                        pcVar16 = p_00->pMan->sError;
                        uVar18 = (ulong)pVVar4->nSize;
                        uVar38 = 0xffffffff;
                        if ((long)uVar18 < 1) goto LAB_002d0bce;
                        uVar33 = 0;
                        goto LAB_002d0b6c;
                      }
                      uVar33 = uVar33 + 1;
                    } while (uVar38 != uVar33);
                  }
                  uVar38 = uVar38 - 1;
                  lVar36 = lVar36 + 8;
                  uVar33 = uVar34;
                } while (uVar34 != uVar18);
              }
            }
            lVar42 = lVar42 + 1;
            pVVar27 = p_00->vMvs;
          } while (lVar42 < pVVar27->nSize);
        }
      }
      iVar11 = p_00->vResets->nSize;
      if (0 < iVar11) {
        if (p_00->vLatches->nSize != iVar11) {
          uVar18 = (ulong)p->vLines->nSize;
          uVar38 = 0xffffffff;
          if ((long)uVar18 < 1) goto LAB_002d0f79;
          uVar33 = 0;
          goto LAB_002d0d97;
        }
        if (p->fUseReset != 0) {
          pAVar17 = Io_ReadCreateResetLatch(p_00->pNtk,p->fBlifMv);
          p_00->pResetLatch = pAVar17;
        }
      }
      pVVar27 = p_00->vFlops;
      if (0 < pVVar27->nSize) {
        lVar42 = 0;
        do {
          if (p_00->pMan->fBlifMv != 0) {
            __assert_fail("!p->pMan->fBlifMv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x4ff,"int Io_MvParseLineFlop(Io_MvMod_t *, char *)");
          }
          pVVar4 = p_00->pMan->vTokens;
          Io_MvSplitIntoTokens(pVVar4,(char *)pVVar27->pArray[lVar42],'\0');
          uVar13 = pVVar4->nSize;
          if ((int)uVar13 < 1) goto LAB_002d1423;
          ppvVar30 = pVVar4->pArray;
          pcVar41 = (char *)*ppvVar30;
          iVar11 = strcmp(pcVar41,"flop");
          if (iVar11 != 0) {
            __assert_fail("!strcmp(pToken, \"flop\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x502,"int Io_MvParseLineFlop(Io_MvMod_t *, char *)");
          }
          uVar18 = 0;
          while ((pcVar16 = (char *)ppvVar30[uVar18], *pcVar16 != 'Q' || (pcVar16[1] != '='))) {
            uVar18 = uVar18 + 1;
            if (uVar13 == uVar18) {
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d0bc0;
              uVar33 = 0;
              goto LAB_002d0b1d;
            }
          }
          uVar18 = 0;
          while ((pcVar43 = (char *)ppvVar30[uVar18], *pcVar43 != 'D' || (pcVar43[1] != '='))) {
            uVar18 = uVar18 + 1;
            if (uVar13 == uVar18) {
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d0cad;
              uVar33 = 0;
              goto LAB_002d0ba7;
            }
          }
          pAVar17 = Io_ReadCreateLatch(p_00->pNtk,pcVar43 + 2,pcVar16 + 2);
          iVar11 = pVVar4->nSize;
          if (0 < (long)iVar11) {
            ppvVar30 = pVVar4->pArray;
            lVar40 = 0;
            do {
              pcVar41 = (char *)ppvVar30[lVar40];
              iVar12 = strncmp(pcVar41,"init=",5);
              if (iVar12 == 0) {
                cVar31 = pcVar41[5];
                if (cVar31 == '0') {
                  aVar19 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
                  if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 8) goto LAB_002d14be;
                  goto LAB_002cf744;
                }
                if (cVar31 == '1') {
                  aVar19 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
                  if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 8) goto LAB_002d15f4;
                  goto LAB_002cf744;
                }
                if (cVar31 != '2') {
                  pVVar27 = p_00->pMan->vLines;
                  pcVar16 = p_00->pMan->sError;
                  uVar18 = (ulong)pVVar27->nSize;
                  uVar38 = 0xffffffff;
                  if ((long)uVar18 < 1) goto LAB_002d1414;
                  uVar33 = 0;
                  goto LAB_002d1402;
                }
                break;
              }
              lVar40 = lVar40 + 1;
            } while (iVar11 != lVar40);
          }
          aVar19 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
          if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 8) goto LAB_002d153a;
LAB_002cf744:
          pAVar17->field_5 = aVar19;
          lVar42 = lVar42 + 1;
          pVVar27 = p_00->vFlops;
        } while (lVar42 < pVVar27->nSize);
      }
      pVVar27 = p_00->vLatches;
      if (0 < pVVar27->nSize) {
        lVar42 = 0;
        do {
          pVVar4 = p_00->pMan->vTokens;
          Io_MvSplitIntoTokens(pVVar4,(char *)pVVar27->pArray[lVar42],'\0');
          uVar13 = pVVar4->nSize;
          if ((int)uVar13 < 1) goto LAB_002d1423;
          ppvVar30 = pVVar4->pArray;
          pcVar41 = (char *)*ppvVar30;
          iVar11 = strcmp(pcVar41,"latch");
          if (iVar11 != 0) {
            __assert_fail("!strcmp(pToken, \"latch\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x4bd,"int Io_MvParseLineLatch(Io_MvMod_t *, char *)");
          }
          if (uVar13 < 3) {
            pVVar27 = p_00->pMan->vLines;
            pcVar16 = p_00->pMan->sError;
            uVar18 = (ulong)pVVar27->nSize;
            uVar38 = 0xffffffff;
            if ((long)uVar18 < 1) goto LAB_002d0cbb;
            uVar33 = 0;
            goto LAB_002d0c0f;
          }
          if (p_00->pResetLatch == (Abc_Obj_t *)0x0) {
            pAVar17 = Io_ReadCreateLatch(p_00->pNtk,(char *)ppvVar30[1],(char *)ppvVar30[2]);
            if (p_00->pMan->fBlifMv == 0) {
              uVar13 = pVVar4->nSize;
              if (6 < (int)uVar13) {
                pVVar27 = p_00->pMan->vLines;
                lVar40 = (long)pVVar27->nSize;
                if (0 < lVar40) {
                  lVar36 = 0;
                  do {
                    if (pcVar41 < pVVar27->pArray[lVar36]) break;
                    lVar36 = lVar36 + 1;
                  } while (lVar40 != lVar36);
                }
                printf(
                      "Warning: Line %d has .latch directive with unrecognized entries (the total of %d entries).\n"
                      );
                uVar13 = pVVar4->nSize;
              }
              if (3 < (int)uVar13) {
                ppvVar30 = pVVar4->pArray;
                uVar13 = atoi((char *)ppvVar30[(ulong)uVar13 - 1]);
                if (3 < uVar13) {
                  pVVar27 = p_00->pMan->vLines;
                  pcVar16 = p_00->pMan->sError;
                  uVar18 = (ulong)pVVar27->nSize;
                  uVar38 = 0xffffffff;
                  if ((long)uVar18 < 1) goto LAB_002d10e8;
                  uVar33 = 0;
                  goto LAB_002d0edc;
                }
                if (uVar13 == 1) {
                  aVar19 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
                  if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 8) {
LAB_002d15f4:
                    __assert_fail("Abc_ObjIsLatch(pLatch)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                                  ,0x1a4,"void Abc_LatchSetInit1(Abc_Obj_t *)");
                  }
                  goto LAB_002cf940;
                }
                if (uVar13 == 0) goto LAB_002cf896;
              }
              aVar19 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
              if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 8) {
LAB_002d153a:
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                              ,0x1a5,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
              }
            }
            else {
LAB_002cf896:
              aVar19 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
              if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 8) goto LAB_002d14be;
            }
          }
          else {
            pAVar17 = Abc_NtkFindOrCreateNet(p_00->pNtk,(char *)ppvVar30[2]);
            pAVar24 = p_00->pNtk;
            pcVar41 = Abc_ObjNameSuffix(pAVar17,"_out");
            pAVar17 = Abc_NtkFindOrCreateNet(pAVar24,pcVar41);
            if (pVVar4->nSize < 2) goto LAB_002d1423;
            pAVar24 = p_00->pNtk;
            pcVar41 = (char *)pVVar4->pArray[1];
            pcVar16 = Abc_ObjName(pAVar17);
            pAVar17 = Io_ReadCreateLatch(pAVar24,pcVar41,pcVar16);
            if ((*(uint *)&pAVar17->field_0x14 & 0xf) != 8) {
LAB_002d14be:
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                            ,0x1a3,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
            aVar19 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
          }
LAB_002cf940:
          pAVar17->field_5 = aVar19;
          lVar42 = lVar42 + 1;
          pVVar27 = p_00->vLatches;
        } while (lVar42 < pVVar27->nSize);
      }
      if ((p->fUseReset != 0) && (pVVar27 = p_00->vResets, 0 < pVVar27->nSize)) {
        lVar42 = 0;
        do {
          iVar11 = Io_MvParseLineNamesMv(p_00,(char *)pVVar27->pArray[lVar42],1);
          if (iVar11 == 0) {
            return (Abc_Des_t *)0x0;
          }
          lVar42 = lVar42 + 1;
          pVVar27 = p_00->vResets;
        } while (lVar42 < pVVar27->nSize);
      }
      pVVar27 = p_00->vNames;
      if (p->fBlifMv == 0) {
        if (0 < pVVar27->nSize) {
          lVar42 = 0;
          do {
            if (p_00->pMan->fBlifMv != 0) {
              __assert_fail("!p->pMan->fBlifMv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x81e,"int Io_MvParseLineNamesBlif(Io_MvMod_t *, char *)");
            }
            pVVar4 = p_00->pMan->vTokens;
            Io_MvSplitIntoTokens(pVVar4,(char *)pVVar27->pArray[lVar42],'\0');
            iVar11 = pVVar4->nSize;
            if ((long)iVar11 < 1) goto LAB_002d1423;
            ppvVar30 = pVVar4->pArray;
            pcVar41 = (char *)*ppvVar30;
            iVar12 = strcmp(pcVar41,"gate");
            if (iVar12 != 0) {
              iVar12 = strcmp(pcVar41,"names");
              if (iVar12 != 0) {
                __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"names\")",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                              ,0x824,"int Io_MvParseLineNamesBlif(Io_MvMod_t *, char *)");
              }
              pcVar41 = (char *)ppvVar30[(long)iVar11 + -1];
              pAVar17 = Abc_NtkFindOrCreateNet(p_00->pNtk,pcVar41);
              if (0 < (pAVar17->vFanins).nSize) {
                pVVar27 = p_00->pMan->vLines;
                pcVar16 = p_00->pMan->sError;
                uVar18 = (ulong)pVVar27->nSize;
                uVar38 = 0xffffffff;
                if ((long)uVar18 < 1) goto LAB_002d10da;
                uVar33 = 0;
                goto LAB_002d10c8;
              }
              pAVar17 = Io_ReadCreateNode(p_00->pNtk,pcVar41,(char **)(pVVar4->pArray + 1),
                                          pVVar4->nSize + -2);
              sVar20 = strlen(pcVar41);
              uVar18 = (ulong)(uint)(pAVar17->vFanins).nSize;
              pIVar9 = p_00->pMan;
              pVVar27 = pIVar9->vTokens;
              pVVar5 = pIVar9->vFunc;
              pIVar9->nTablesRead = pIVar9->nTablesRead + 1;
              Io_MvSplitIntoTokens(pVVar27,pcVar41 + sVar20,'.');
              uVar13 = pVVar27->nSize;
              if (uVar13 == 1) {
                pbVar35 = (byte *)*pVVar27->pArray;
                bVar1 = *pbVar35;
                if ((((1 < bVar1 - 0x30) && (bVar1 != 0x78)) && (bVar1 != 0x6e)) ||
                   (pbVar35[1] != 0)) {
                  pIVar9 = p_00->pMan;
                  uVar18 = (ulong)pIVar9->vLines->nSize;
                  uVar38 = 0xffffffff;
                  if ((long)uVar18 < 1) goto LAB_002d13ba;
                  uVar33 = 0;
                  goto LAB_002d131b;
                }
                pMVar39 = (Mem_Flex_t *)p_00->pNtk->pManFunc;
                if (bVar1 == 0x30) goto LAB_002cfcb5;
                pcVar41 = Abc_SopCreateConst1(pMVar39);
              }
              else if (uVar13 == 0) {
                pMVar39 = (Mem_Flex_t *)p_00->pNtk->pManFunc;
LAB_002cfcb5:
                pcVar41 = Abc_SopCreateConst0(pMVar39);
              }
              else {
                if ((int)uVar13 < 1) goto LAB_002d1423;
                if ((uVar13 & 1) != 0) {
                  pVVar4 = p_00->pMan->vLines;
                  uVar18 = (ulong)pVVar4->nSize;
                  uVar38 = 0xffffffff;
                  if ((long)uVar18 < 1) goto LAB_002d13c8;
                  uVar33 = 0;
                  goto LAB_002d1360;
                }
                pVVar5->nSize = 0;
                uVar38 = 0xffffffff;
                lVar40 = 0;
                do {
                  if (((long)(int)uVar13 <= lVar40 * 2) ||
                     (uVar33 = lVar40 * 2 | 1, uVar13 <= uVar33)) goto LAB_002d1423;
                  __s = (byte *)pVVar27->pArray[lVar40 * 2];
                  pbVar35 = (byte *)pVVar27->pArray[uVar33];
                  sVar20 = strlen((char *)__s);
                  if (sVar20 != uVar18) {
                    pIVar9 = p_00->pMan;
                    uVar38 = (ulong)pIVar9->vLines->nSize;
                    uVar33 = 0xffffffff;
                    if ((long)uVar38 < 1) goto LAB_002d10fa;
                    uVar34 = 0;
                    goto LAB_002d0f1e;
                  }
                  bVar1 = *pbVar35;
                  if ((((1 < bVar1 - 0x30) && (bVar1 != 0x78)) && (bVar1 != 0x6e)) ||
                     (pbVar35[1] != 0)) {
                    pIVar9 = p_00->pMan;
                    uVar18 = (ulong)pIVar9->vLines->nSize;
                    uVar38 = 0xffffffff;
                    if ((long)uVar18 < 1) goto LAB_002d108e;
                    uVar33 = 0;
                    goto LAB_002d0e9a;
                  }
                  uVar32 = (uint)uVar38;
                  uVar10 = (uint)(bVar1 == 0x78 || bVar1 == 0x31);
                  uVar13 = uVar10;
                  if ((uVar32 != 0xffffffff) && (uVar13 = uVar32, uVar32 != uVar10)) {
                    pIVar9 = p_00->pMan;
                    uVar18 = (ulong)pIVar9->vLines->nSize;
                    uVar33 = 0xffffffff;
                    if ((long)uVar18 < 1) goto LAB_002d12bc;
                    uVar34 = 0;
                    goto LAB_002d1067;
                  }
                  sVar20 = strlen((char *)__s);
                  if (0 < (int)(uint)sVar20) {
                    uVar38 = 0;
                    do {
                      bVar1 = __s[uVar38];
                      uVar10 = pVVar5->nSize;
                      if (uVar10 == pVVar5->nCap) {
                        if ((int)uVar10 < 0x10) {
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar41 = (char *)malloc(0x10);
                          }
                          else {
                            pcVar41 = (char *)realloc(pVVar5->pArray,0x10);
                          }
                          pVVar5->pArray = pcVar41;
                          pVVar5->nCap = 0x10;
                        }
                        else {
                          __size = (ulong)uVar10 * 2;
                          if (pVVar5->pArray == (char *)0x0) {
                            pcVar41 = (char *)malloc(__size);
                          }
                          else {
                            pcVar41 = (char *)realloc(pVVar5->pArray,__size);
                          }
                          pVVar5->pArray = pcVar41;
                          pVVar5->nCap = (int)__size;
                        }
                      }
                      else {
                        pcVar41 = pVVar5->pArray;
                      }
                      iVar11 = pVVar5->nSize;
                      pVVar5->nSize = iVar11 + 1;
                      pcVar41[iVar11] = bVar1;
                      uVar38 = uVar38 + 1;
                    } while (((uint)sVar20 & 0x7fffffff) != uVar38);
                  }
                  uVar10 = pVVar5->nSize;
                  if (uVar10 == pVVar5->nCap) {
                    if ((int)uVar10 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar41 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar41 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar41;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar20 = (ulong)uVar10 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar41 = (char *)malloc(sVar20);
                      }
                      else {
                        pcVar41 = (char *)realloc(pVVar5->pArray,sVar20);
                      }
                      pVVar5->pArray = pcVar41;
                      pVVar5->nCap = (int)sVar20;
                    }
                  }
                  else {
                    pcVar41 = pVVar5->pArray;
                  }
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar41[iVar11] = ' ';
                  bVar1 = *pbVar35;
                  uVar10 = pVVar5->nSize;
                  if (uVar10 == pVVar5->nCap) {
                    if ((int)uVar10 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar41 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar41 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar41;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar20 = (ulong)uVar10 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar41 = (char *)malloc(sVar20);
                      }
                      else {
                        pcVar41 = (char *)realloc(pVVar5->pArray,sVar20);
                      }
                      pVVar5->pArray = pcVar41;
                      pVVar5->nCap = (int)sVar20;
                    }
                  }
                  else {
                    pcVar41 = pVVar5->pArray;
                  }
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar41[iVar11] = bVar1;
                  uVar10 = pVVar5->nSize;
                  if (uVar10 == pVVar5->nCap) {
                    if ((int)uVar10 < 0x10) {
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar41 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar41 = (char *)realloc(pVVar5->pArray,0x10);
                      }
                      pVVar5->pArray = pcVar41;
                      pVVar5->nCap = 0x10;
                    }
                    else {
                      sVar20 = (ulong)uVar10 * 2;
                      if (pVVar5->pArray == (char *)0x0) {
                        pcVar41 = (char *)malloc(sVar20);
                      }
                      else {
                        pcVar41 = (char *)realloc(pVVar5->pArray,sVar20);
                      }
                      pVVar5->pArray = pcVar41;
                      pVVar5->nCap = (int)sVar20;
                    }
                  }
                  else {
                    pcVar41 = pVVar5->pArray;
                  }
                  uVar38 = (ulong)uVar13;
                  iVar11 = pVVar5->nSize;
                  pVVar5->nSize = iVar11 + 1;
                  pcVar41[iVar11] = '\n';
                  lVar40 = lVar40 + 1;
                  uVar13 = pVVar27->nSize;
                } while (lVar40 < (int)uVar13 / 2);
                uVar13 = pVVar5->nSize;
                if (uVar13 == pVVar5->nCap) {
                  if ((int)uVar13 < 0x10) {
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar41 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar41 = (char *)realloc(pVVar5->pArray,0x10);
                    }
                    pVVar5->pArray = pcVar41;
                    pVVar5->nCap = 0x10;
                  }
                  else {
                    sVar20 = (ulong)uVar13 * 2;
                    if (pVVar5->pArray == (char *)0x0) {
                      pcVar41 = (char *)malloc(sVar20);
                    }
                    else {
                      pcVar41 = (char *)realloc(pVVar5->pArray,sVar20);
                    }
                    pVVar5->pArray = pcVar41;
                    pVVar5->nCap = (int)sVar20;
                  }
                }
                else {
                  pcVar41 = pVVar5->pArray;
                }
                iVar11 = pVVar5->nSize;
                pVVar5->nSize = iVar11 + 1;
                pcVar41[iVar11] = '\0';
                pcVar41 = pVVar5->pArray;
              }
              (pAVar17->field_5).pData = pcVar41;
              if (pcVar41 == (char *)0x0) {
                return (Abc_Des_t *)0x0;
              }
              pcVar41 = Abc_SopRegister((Mem_Flex_t *)p_00->pNtk->pManFunc,pcVar41);
              (pAVar17->field_5).pData = pcVar41;
              goto LAB_002d00ab;
            }
            pMVar22 = (Mio_Library_t *)Abc_FrameReadLibGen();
            if (pMVar22 == (Mio_Library_t *)0x0) {
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d12e4;
              uVar33 = 0;
              goto LAB_002d11d8;
            }
            if (pVVar4->nSize < 2) {
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d1380;
              uVar33 = 0;
              goto LAB_002d1217;
            }
            pMVar23 = Mio_LibraryReadGateByName(pMVar22,(char *)pVVar4->pArray[1],(char *)0x0);
            if (pMVar23 == (Mio_Gate_t *)0x0) {
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d138e;
              uVar33 = 0;
              goto LAB_002d1264;
            }
            pAVar24 = p_00->pNtk;
            if (pAVar24->nObjCounts[7] == 0) {
              if (pAVar24->ntkFunc != ABC_FUNC_SOP) {
                __assert_fail("p->pNtk->ntkFunc == ABC_FUNC_SOP",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                              ,0x8e1,"int Io_MvParseLineGateBlif(Io_MvMod_t *, Vec_Ptr_t *)");
              }
              pAVar24->ntkFunc = ABC_FUNC_MAP;
              Mem_FlexStop((Mem_Flex_t *)pAVar24->pManFunc,0);
              p_00->pNtk->pManFunc = pMVar22;
            }
            pMVar21 = Mio_GateReadTwin(pMVar23);
            iVar11 = Io_ReadBlifReorderFormalNames(pVVar4,pMVar23,pMVar21);
            if (iVar11 == 0) {
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d13a4;
              uVar33 = 0;
              goto LAB_002d12a3;
            }
            iVar11 = pVVar4->nSize;
            if (2 < (long)iVar11) {
              ppvVar30 = pVVar4->pArray;
              lVar40 = 2;
              do {
                pcVar16 = (char *)ppvVar30[lVar40];
                if (pcVar16 != (char *)0x0) {
                  sVar20 = strlen(pcVar16);
                  if (0 < (int)(uint)sVar20) {
                    uVar18 = (ulong)((uint)sVar20 & 0x7fffffff);
                    do {
                      pcVar43 = pcVar16 + 1;
                      if (*pcVar16 == '=') goto LAB_002cfbf9;
                      uVar18 = uVar18 - 1;
                      pcVar16 = pcVar43;
                    } while (uVar18 != 0);
                  }
                  pcVar43 = (char *)0x0;
LAB_002cfbf9:
                  ppvVar30[lVar40] = pcVar43;
                  ppvVar30 = pVVar4->pArray;
                  if (ppvVar30[lVar40] == (void *)0x0) {
                    pVVar27 = p_00->pMan->vLines;
                    pcVar16 = p_00->pMan->sError;
                    uVar18 = (ulong)pVVar27->nSize;
                    uVar38 = 0xffffffff;
                    if ((long)uVar18 < 1) goto LAB_002d1080;
                    uVar33 = 0;
                    goto LAB_002d0e58;
                  }
                }
                lVar40 = lVar40 + 1;
              } while (lVar40 != iVar11);
            }
            pMVar21 = Mio_GateReadTwin(pMVar23);
            ppvVar30 = pVVar4->pArray;
            pNamesIn = (char **)(ppvVar30 + 2);
            iVar11 = pVVar4->nSize;
            if (pMVar21 == (Mio_Gate_t *)0x0) {
              pAVar17 = Io_ReadCreateNode(p_00->pNtk,(char *)ppvVar30[(long)iVar11 + -1],pNamesIn,
                                          iVar11 + -3);
              (pAVar17->field_5).pData = pMVar23;
            }
            else {
              if ((char *)ppvVar30[(long)iVar11 + -2] == (char *)0x0) {
                pcVar41 = (char *)ppvVar30[(long)iVar11 + -1];
                if (pcVar41 == (char *)0x0) {
                  __assert_fail("ppNames[nNames] != NULL || ppNames[nNames+1] != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                                ,0x907,"int Io_MvParseLineGateBlif(Io_MvMod_t *, Vec_Ptr_t *)");
                }
              }
              else {
                pAVar17 = Io_ReadCreateNode(p_00->pNtk,(char *)ppvVar30[(long)iVar11 + -2],pNamesIn,
                                            iVar11 + -4);
                (pAVar17->field_5).pData = pMVar23;
                pcVar41 = (char *)ppvVar30[(long)iVar11 + -1];
                if (pcVar41 == (char *)0x0) goto LAB_002d00ab;
              }
              pAVar17 = Io_ReadCreateNode(p_00->pNtk,pcVar41,pNamesIn,iVar11 + -4);
              pMVar23 = Mio_GateReadTwin(pMVar23);
              (pAVar17->field_5).pData = pMVar23;
            }
LAB_002d00ab:
            lVar42 = lVar42 + 1;
            pVVar27 = p_00->vNames;
          } while (lVar42 < pVVar27->nSize);
        }
        pVVar27 = p_00->vShorts;
        if (0 < pVVar27->nSize) {
          lVar42 = 0;
          do {
            if (p_00->pMan->fBlifMv != 0) {
              __assert_fail("!p->pMan->fBlifMv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x84e,"int Io_MvParseLineShortBlif(Io_MvMod_t *, char *)");
            }
            pVVar4 = p_00->pMan->vTokens;
            Io_MvSplitIntoTokens(pVVar4,(char *)pVVar27->pArray[lVar42],'\0');
            if (pVVar4->nSize != 3) {
              if (pVVar4->nSize < 1) goto LAB_002d1423;
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d1230;
              uVar33 = 0;
              goto LAB_002d0fe6;
            }
            ppvVar30 = pVVar4->pArray;
            iVar11 = strcmp((char *)*ppvVar30,"short");
            if (iVar11 != 0) {
              __assert_fail("!strcmp((char *)Vec_PtrEntry(vTokens,0), \"short\")",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x856,"int Io_MvParseLineShortBlif(Io_MvMod_t *, char *)");
            }
            pcVar41 = (char *)ppvVar30[2];
            pAVar17 = Abc_NtkFindOrCreateNet(p_00->pNtk,pcVar41);
            if (0 < (pAVar17->vFanins).nSize) {
              pVVar27 = p_00->pMan->vLines;
              pcVar16 = p_00->pMan->sError;
              uVar18 = (ulong)pVVar27->nSize;
              uVar38 = 0xffffffff;
              if ((long)uVar18 < 1) goto LAB_002d10da;
              uVar33 = 0;
              goto LAB_002d1025;
            }
            pAVar17 = Io_ReadCreateNode(p_00->pNtk,pcVar41,(char **)(pVVar4->pArray + 1),1);
            if (p_00->pNtk->ntkFunc == ABC_FUNC_MAP) {
              pMVar22 = (Mio_Library_t *)Abc_FrameReadLibGen();
              if (pMVar22 == (Mio_Library_t *)0x0) {
                pVVar27 = p_00->pMan->vLines;
                pcVar16 = p_00->pMan->sError;
                uVar18 = (ulong)pVVar27->nSize;
                uVar38 = 0xffffffff;
                if ((long)uVar18 < 1) goto LAB_002d12e4;
                uVar33 = 0;
                goto LAB_002d1136;
              }
              pMVar23 = Mio_LibraryReadBuf(pMVar22);
              if (pMVar23 == (Mio_Gate_t *)0x0) {
                pVVar27 = p_00->pMan->vLines;
                pcVar16 = p_00->pMan->sError;
                uVar18 = (ulong)pVVar27->nSize;
                uVar38 = 0xffffffff;
                if ((long)uVar18 < 1) goto LAB_002d1372;
                uVar33 = 0;
                goto LAB_002d1175;
              }
            }
            else {
              pMVar23 = (Mio_Gate_t *)Abc_SopRegister((Mem_Flex_t *)p_00->pNtk->pManFunc,"1 1\n");
            }
            (pAVar17->field_5).pData = pMVar23;
            lVar42 = lVar42 + 1;
            pVVar27 = p_00->vShorts;
          } while (lVar42 < pVVar27->nSize);
        }
      }
      else if (0 < pVVar27->nSize) {
        lVar42 = 0;
        do {
          iVar11 = Io_MvParseLineNamesMv(p_00,(char *)pVVar27->pArray[lVar42],0);
          if (iVar11 == 0) {
            return (Abc_Des_t *)0x0;
          }
          lVar42 = lVar42 + 1;
          pVVar27 = p_00->vNames;
        } while (lVar42 < pVVar27->nSize);
      }
      pVVar27 = p_00->vSubckts;
      if (0 < pVVar27->nSize) {
        lVar42 = 0;
        do {
          pcVar41 = (char *)pVVar27->pArray[lVar42];
          cVar31 = *pcVar41;
          if (cVar31 == '\0') {
            iVar11 = 0;
          }
          else {
            iVar11 = 0;
            pcVar16 = pcVar41;
            do {
              pcVar16 = pcVar16 + 1;
              iVar11 = iVar11 + (uint)(cVar31 == '=');
              cVar31 = *pcVar16;
            } while (cVar31 != '\0');
          }
          pVVar27 = p_00->pMan->vTokens;
          Io_MvSplitIntoTokensAndClear(pVVar27,pcVar41,'=','\0');
          iVar12 = pVVar27->nSize;
          if (iVar12 < 1) goto LAB_002d1423;
          ppvVar30 = pVVar27->pArray;
          iVar14 = strcmp((char *)*ppvVar30,"subckt");
          if (iVar14 != 0) {
            __assert_fail("!strcmp(pToken, \"subckt\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                          ,0x550,"int Io_MvParseLineSubckt(Io_MvMod_t *, char *)");
          }
          if (iVar12 == 1) goto LAB_002d1423;
          pcVar41 = (char *)ppvVar30[1];
          for (pcVar43 = pcVar41; *pcVar43 != '\0'; pcVar43 = pcVar43 + 1) {
            if (*pcVar43 == '|') {
              *pcVar43 = '\0';
              break;
            }
          }
          pAVar24 = Abc_DesFindModelByName(p_00->pMan->pDesign,pcVar41);
          if (pAVar24 == (Abc_Ntk_t *)0x0) {
            pVVar27 = p_00->pMan->vLines;
            pcVar16 = p_00->pMan->sError;
            uVar18 = (ulong)pVVar27->nSize;
            uVar38 = 0xffffffff;
            if ((long)uVar18 < 1) goto LAB_002d0e04;
            uVar33 = 0;
            goto LAB_002d0cef;
          }
          ppvVar30 = pVVar27->pArray;
          lVar40 = (long)p_00->pMan->fBlifMv;
          pAVar17 = Abc_NtkCreateObj(p_00->pNtk,
                                     (pAVar24->ntkFunc == ABC_FUNC_BLACKBOX) + ABC_OBJ_WHITEBOX);
          (pAVar17->field_5).pData = pAVar24;
          if (p_00->pMan->fBlifMv != 0) {
            if (pVVar27->nSize < 3) goto LAB_002d1423;
            Abc_ObjAssignName(pAVar17,(char *)pVVar27->pArray[2],(char *)0x0);
          }
          pVVar27 = pAVar24->vPis;
          if (0 < pVVar27->nSize) {
            lVar36 = 0;
            iVar12 = 0;
            do {
              pcVar41 = Abc_ObjName(*(Abc_Obj_t **)
                                     (*(long *)(*(long *)(*pVVar27->pArray[lVar36] + 0x20) + 8) +
                                     (long)**(int **)((long)pVVar27->pArray[lVar36] + 0x30) * 8));
              if (0 < iVar11) {
                iVar14 = 0;
                do {
                  uVar13 = ((iVar14 + iVar12) % iVar11) * 2;
                  iVar15 = strcmp((char *)ppvVar30[lVar40 + (long)(int)uVar13 + 2],pcVar41);
                  if (iVar15 == 0) {
                    iVar12 = iVar12 + iVar14 + 1;
                    if ((char *)ppvVar30[lVar40 + (long)(int)(uVar13 | 1) + 2] != (char *)0x0) {
                      pAVar26 = Abc_NtkFindOrCreateNet
                                          (p_00->pNtk,
                                           (char *)ppvVar30[lVar40 + (long)(int)(uVar13 | 1) + 2]);
                      goto LAB_002d0449;
                    }
                    break;
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar11 != iVar14);
              }
              pAVar25 = Abc_NtkCreateObj(p_00->pNtk,ABC_OBJ_NODE);
              pcVar41 = Abc_SopRegister((Mem_Flex_t *)p_00->pNtk->pManFunc," 0\n");
              (pAVar25->field_5).pData = pcVar41;
              pAVar6 = p_00->pNtk;
              pcVar41 = Abc_ObjNameSuffix(pAVar25,"abc");
              pAVar26 = Abc_NtkFindOrCreateNet(pAVar6,pcVar41);
              Abc_ObjAddFanin(pAVar26,pAVar25);
LAB_002d0449:
              pAVar25 = Abc_NtkCreateObj(p_00->pNtk,ABC_OBJ_BI);
              Abc_ObjAddFanin(pAVar17,pAVar25);
              Abc_ObjAddFanin(pAVar25,pAVar26);
              lVar36 = lVar36 + 1;
              pVVar27 = pAVar24->vPis;
            } while (lVar36 < pVVar27->nSize);
          }
          pVVar27 = pAVar24->vPos;
          if (0 < pVVar27->nSize) {
            lVar36 = 0;
            iVar12 = 0;
            do {
              pcVar41 = Abc_ObjName(*(Abc_Obj_t **)
                                     (*(long *)(*(long *)(*pVVar27->pArray[lVar36] + 0x20) + 8) +
                                     (long)**(int **)((long)pVVar27->pArray[lVar36] + 0x20) * 8));
              if (0 < iVar11) {
                iVar14 = 0;
                do {
                  uVar13 = ((iVar12 + iVar14) % iVar11) * 2;
                  iVar15 = strcmp((char *)ppvVar30[lVar40 + (long)(int)uVar13 + 2],pcVar41);
                  if (iVar15 == 0) {
                    pcVar41 = (char *)ppvVar30[lVar40 + (long)(int)(uVar13 | 1) + 2];
                    iVar12 = iVar12 + iVar14 + 1;
                    goto LAB_002d0519;
                  }
                  iVar14 = iVar14 + 1;
                } while (iVar11 != iVar14);
              }
              pcVar41 = (char *)0x0;
LAB_002d0519:
              pAVar26 = Abc_NtkCreateObj(p_00->pNtk,ABC_OBJ_BO);
              pAVar6 = p_00->pNtk;
              if (pcVar41 == (char *)0x0) {
                pcVar41 = Abc_ObjNameSuffix(pAVar26,"abc");
              }
              pAVar25 = Abc_NtkFindOrCreateNet(pAVar6,pcVar41);
              Abc_ObjAddFanin(pAVar25,pAVar26);
              Abc_ObjAddFanin(pAVar26,pAVar17);
              lVar36 = lVar36 + 1;
              pVVar27 = pAVar24->vPos;
            } while (lVar36 < pVVar27->nSize);
          }
          lVar42 = lVar42 + 1;
          pVVar27 = p_00->vSubckts;
        } while (lVar42 < pVVar27->nSize);
      }
      pAVar24 = p_00->pNtk;
      if ((((pAVar24->nObjCounts[8] == 0) && (pAVar24->nObjCounts[7] == 0)) &&
          (pAVar24->vBoxes->nSize == 0)) && (pAVar24->ntkFunc == ABC_FUNC_SOP)) {
        Mem_FlexStop((Mem_Flex_t *)pAVar24->pManFunc,0);
        pAVar24 = p_00->pNtk;
        pAVar24->pManFunc = (void *)0x0;
        pAVar24->ntkFunc = ABC_FUNC_BLACKBOX;
      }
      Abc_NtkFinalizeRead(pAVar24);
      iVar11 = p_00->vOnehots->nSize;
      if (0 < iVar11) {
        pVVar27 = p_00->pNtk->vBoxes;
        lVar42 = (long)pVVar27->nSize;
        if (0 < lVar42) {
          ppvVar30 = pVVar27->pArray;
          lVar40 = 0;
          do {
            pvVar29 = ppvVar30[lVar40];
            if ((*(uint *)((long)pvVar29 + 0x14) & 0xf) == 8) {
              *(long *)((long)pvVar29 + 8) = lVar40;
            }
            lVar40 = lVar40 + 1;
          } while (lVar42 != lVar40);
        }
        pVVar27 = Vec_PtrAlloc(iVar11);
        pAVar24 = p_00->pNtk;
        pAVar24->vOnehots = pVVar27;
        pVVar27 = p_00->vOnehots;
        if (0 < pVVar27->nSize) {
          lVar42 = 0;
          do {
            pVVar4 = p_00->pMan->vTokens;
            Io_MvSplitIntoTokensAndClear(pVVar4,(char *)pVVar27->pArray[lVar42],'=',(char)pAVar24);
            uVar13 = pVVar4->nSize;
            if ((int)uVar13 < 1) {
LAB_002d1423:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            iVar11 = strcmp((char *)*pVVar4->pArray,"onehot");
            if (iVar11 != 0) {
              __assert_fail("!strcmp(pToken, \"onehot\")",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                            ,0x5d8,"Vec_Int_t *Io_MvParseLineOnehot(Io_MvMod_t *, char *)");
            }
            puVar28 = (uint *)malloc(0x10);
            uVar18 = 0x10;
            if (0x10 < uVar13) {
              uVar18 = (ulong)uVar13;
            }
            puVar28[1] = 0;
            *puVar28 = (uint)uVar18;
            pvVar29 = malloc(uVar18 << 2);
            *(void **)(puVar28 + 2) = pvVar29;
            if (uVar13 != 1) {
              lVar40 = 1;
              do {
                pcVar41 = (char *)pVVar4->pArray[lVar40];
                pAVar17 = Abc_NtkFindNet(p_00->pNtk,pcVar41);
                if (pAVar17 == (Abc_Obj_t *)0x0) {
                  pIVar9 = p_00->pMan;
                  uVar18 = (ulong)pIVar9->vLines->nSize;
                  uVar38 = 0xffffffff;
                  if ((long)uVar18 < 1) goto LAB_002d118e;
                  uVar33 = 0;
                  goto LAB_002d0f60;
                }
                plVar7 = (long *)pAVar17->pNtk->vObjs->pArray[*(pAVar17->vFanins).pArray];
                if (((plVar7 == (long *)0x0) ||
                    (lVar36 = *(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                       (long)*(int *)plVar7[4] * 8), lVar36 == 0)) ||
                   ((*(uint *)(lVar36 + 0x14) & 0xf) != 8)) {
                  pIVar9 = p_00->pMan;
                  uVar18 = (ulong)pIVar9->vLines->nSize;
                  uVar38 = 0xffffffff;
                  if ((long)uVar18 < 1) goto LAB_002d0f97;
                  uVar33 = 0;
                  goto LAB_002d0deb;
                }
                uVar2 = *(undefined4 *)(lVar36 + 8);
                uVar13 = puVar28[1];
                if (uVar13 == *puVar28) {
                  if ((int)uVar13 < 0x10) {
                    if (pvVar29 == (void *)0x0) {
                      pvVar29 = malloc(0x40);
                    }
                    else {
                      pvVar29 = realloc(pvVar29,0x40);
                    }
                    *(void **)(puVar28 + 2) = pvVar29;
                    uVar10 = 0x10;
                    if (pvVar29 == (void *)0x0) {
LAB_002d15b6:
                      __assert_fail("p->pArray",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                    }
                  }
                  else {
                    if (pvVar29 == (void *)0x0) {
                      pvVar29 = malloc((ulong)uVar13 * 8);
                    }
                    else {
                      pvVar29 = realloc(pvVar29,(ulong)uVar13 * 8);
                    }
                    *(void **)(puVar28 + 2) = pvVar29;
                    if (pvVar29 == (void *)0x0) goto LAB_002d15b6;
                    uVar10 = uVar13 * 2;
                  }
                  *puVar28 = uVar10;
                }
                puVar28[1] = uVar13 + 1;
                *(undefined4 *)((long)pvVar29 + (long)(int)uVar13 * 4) = uVar2;
                printf("%d");
                lVar40 = lVar40 + 1;
              } while (lVar40 < pVVar4->nSize);
            }
            putchar(10);
            pVVar27 = p_00->pNtk->vOnehots;
            uVar13 = pVVar27->nSize;
            if (uVar13 == pVVar27->nCap) {
              if ((int)uVar13 < 0x10) {
                if (pVVar27->pArray == (void **)0x0) {
                  ppvVar30 = (void **)malloc(0x80);
                }
                else {
                  ppvVar30 = (void **)realloc(pVVar27->pArray,0x80);
                }
                pVVar27->pArray = ppvVar30;
                pVVar27->nCap = 0x10;
              }
              else {
                if (pVVar27->pArray == (void **)0x0) {
                  ppvVar30 = (void **)malloc((ulong)uVar13 << 4);
                }
                else {
                  ppvVar30 = (void **)realloc(pVVar27->pArray,(ulong)uVar13 << 4);
                }
                pVVar27->pArray = ppvVar30;
                pVVar27->nCap = uVar13 * 2;
              }
            }
            else {
              ppvVar30 = pVVar27->pArray;
            }
            iVar11 = pVVar27->nSize;
            pVVar27->nSize = iVar11 + 1;
            ppvVar30[iVar11] = puVar28;
            lVar42 = lVar42 + 1;
            pVVar27 = p_00->vOnehots;
            pAVar24 = (Abc_Ntk_t *)(long)pVVar27->nSize;
          } while (lVar42 < (long)pAVar24);
          pAVar24 = p_00->pNtk;
        }
        lVar42 = (long)pAVar24->vBoxes->nSize;
        if (0 < lVar42) {
          ppvVar30 = pAVar24->vBoxes->pArray;
          lVar40 = 0;
          do {
            pvVar29 = ppvVar30[lVar40];
            if ((*(uint *)((long)pvVar29 + 0x14) & 0xf) == 8) {
              *(undefined8 *)((long)pvVar29 + 8) = 0;
            }
            lVar40 = lVar40 + 1;
          } while (lVar42 != lVar40);
        }
        printf("Parsed %d groups of 1-hot registers: { ",(ulong)(uint)pAVar24->vOnehots->nSize);
        pVVar27 = p_00->pNtk->vOnehots;
        if (0 < pVVar27->nSize) {
          lVar42 = 0;
          do {
            printf("%d ",(ulong)*(uint *)((long)pVVar27->pArray[lVar42] + 4));
            lVar42 = lVar42 + 1;
            pVVar27 = p_00->pNtk->vOnehots;
          } while (lVar42 < pVVar27->nSize);
        }
        puts("}");
        pVVar27 = p_00->pNtk->vOnehots;
        lVar42 = (long)pVVar27->nSize;
        if (lVar42 < 1) {
          uVar18 = 0;
          dVar45 = 0.0;
        }
        else {
          ppvVar30 = pVVar27->pArray;
          lVar40 = 0;
          uVar18 = 0;
          do {
            uVar18 = (ulong)(uint)((int)uVar18 + *(int *)((long)ppvVar30[lVar40] + 4));
            lVar40 = lVar40 + 1;
          } while (lVar42 != lVar40);
          lVar40 = 0;
          iVar11 = 0;
          do {
            iVar11 = iVar11 + *(int *)((long)ppvVar30[lVar40] + 4);
            lVar40 = lVar40 + 1;
          } while (lVar42 != lVar40);
          dVar45 = (double)iVar11 * 100.0;
        }
        printf("The total number of 1-hot registers = %d. (%.2f %%)\n",
               dVar45 / (double)p_00->pNtk->nObjCounts[8],uVar18);
        pcVar41 = Extra_FileNameGenericAppend(p_00->pMan->pFileName,"_1h.blif");
        pAVar24 = p_00->pNtk;
        Abc_GenOneHotIntervals
                  (pcVar41,pAVar24->vPis->nSize,pAVar24->nObjCounts[8],pAVar24->vOnehots);
        printf("One-hotness condition is written into file \"%s\".\n",pcVar41);
      }
      if (p_00->vFlops->nSize != 0) {
        printf("Warning: The parser converted %d .flop lines into .latch lines\n");
        puts("(information about set, reset, enable of the flops may be lost).");
      }
      lVar37 = lVar37 + 1;
      pVVar27 = p->vModels;
    } while (lVar37 < pVVar27->nSize);
  }
  if (p->nNDnodes != 0) {
    printf("Warning: The parser added %d constant 0 nodes to replace non-deterministic nodes.\n");
  }
  pAVar8 = p->pDesign;
  p->pDesign = (Abc_Des_t *)0x0;
  return pAVar8;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0c4e:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0d4f:
  pcVar41 = "Line %d: The number of values in not specified in .mv line.";
  goto LAB_002d0d56;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0c94:
    if (pcVar41 < pIVar9->vLines->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0db1:
  pcVar41 = "Line %d: The number of values (%d) is incorrect (should be >= 2 and <= %d).";
  uVar33 = 0x100;
  uVar18 = CONCAT44(extraout_var,uVar10);
  goto LAB_002d0e1c;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0b6c:
    if (*pVVar27->pArray < pVVar4->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0bce:
  pcVar43 = "Line %d: Symbolic value name \"%s\" is repeated in .mv line.";
  goto LAB_002d0bd8;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0b1d:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0bc0:
  pcVar41 = "Line %d: Cannot find flop output.";
  goto LAB_002d0d56;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0ba7:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0cad:
  pcVar41 = "Line %d: Cannot find flop input.";
  goto LAB_002d0d56;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d1402:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d1414:
  pcVar43 = "Line %d: Cannot read flop init value %s.";
  goto LAB_002d0bd8;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0c0f:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0cbb:
  pcVar41 = "Line %d: Latch does not have input name and output name.";
  goto LAB_002d0d56;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0edc:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d10e8:
  pcVar41 = (char *)ppvVar30[3];
  pcVar43 = "Line %d: Initial state of the latch is incorrect \"%s\".";
  goto LAB_002d0bd8;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d10c8:
    if (pcVar41 < pVVar27->pArray[uVar33]) goto LAB_002d10d8;
  }
  goto LAB_002d10da;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d131b:
    if (pbVar35 < pIVar9->vLines->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d13ba:
  pcVar41 = "Line %d: Constant table has wrong output value \"%s\".";
  goto LAB_002d1098;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d1360:
    if (*pVVar27->pArray < pVVar4->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d13c8:
  sprintf(p_00->pMan->sError,"Line %d: Table has odd number of tokens (%d).",uVar38);
  goto LAB_002d12d0;
  while (uVar34 = uVar34 + 1, uVar38 != uVar34) {
LAB_002d0f1e:
    if (__s < pIVar9->vLines->pArray[uVar34]) {
      uVar33 = uVar34 & 0xffffffff;
      break;
    }
  }
LAB_002d10fa:
  pcVar41 = "Line %d: Cube \"%s\" has size different from the fanin count (%d).";
  goto LAB_002d12c9;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0e9a:
    if (__s < pIVar9->vLines->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d108e:
  pcVar41 = "Line %d: Output value \"%s\" is incorrect.";
LAB_002d1098:
  sprintf(pIVar9->sError,pcVar41,uVar38,pbVar35);
  goto LAB_002d12d0;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d11d8:
    if (pcVar41 < pVVar27->pArray[uVar33]) goto LAB_002d12e2;
  }
  goto LAB_002d12e4;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d1217:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d1380:
  pcVar41 = "Line %d: The .gate line has less than two tokens.";
  goto LAB_002d0d56;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d1264:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d138e:
  pcVar41 = (char *)pVVar4->pArray[1];
  pcVar43 = "Line %d: Cannot find gate \"%s\" in the library.";
  goto LAB_002d0bd8;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d12a3:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d13a4:
  pcVar41 = (char *)pVVar4->pArray[1];
  pcVar43 = "Line %d: Mismatch in the fanins of gate \"%s\".";
  goto LAB_002d0bd8;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0e58:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d1080:
  pcVar41 = "Line %d: Invalid gate input assignment.";
  goto LAB_002d0d56;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0fe6:
    if (*pVVar4->pArray < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d1230:
  pcVar41 = "Line %d: Expecting three entries in the .short line.";
  goto LAB_002d0d56;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d1025:
    if (pcVar41 < pVVar27->pArray[uVar33]) goto LAB_002d10d8;
  }
LAB_002d10da:
  pcVar43 = "Line %d: Signal \"%s\" is defined more than once.";
  goto LAB_002d0bd8;
LAB_002d10d8:
  uVar38 = uVar33 & 0xffffffff;
  goto LAB_002d10da;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d1136:
    if (pcVar41 < pVVar27->pArray[uVar33]) goto LAB_002d12e2;
  }
LAB_002d12e4:
  pcVar41 = "Line %d: The current library is not available.";
  goto LAB_002d0d56;
LAB_002d12e2:
  uVar38 = uVar33 & 0xffffffff;
  goto LAB_002d12e4;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0f60:
    if (pcVar41 < pIVar9->vLines->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d118e:
  pcVar16 = p_00->pNtk->pName;
  pcVar43 = "Line %d: Signal with name \"%s\" does not exist in the model \"%s\".";
  goto LAB_002d11a1;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d1175:
    if (pcVar41 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d1372:
  pcVar41 = "Line %d: Cannot find buffer gate in the library.";
LAB_002d0d56:
  sprintf(pcVar16,pcVar41,uVar38);
  return (Abc_Des_t *)0x0;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0cef:
    if (pcVar43 < pVVar27->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0e04:
  pcVar43 = "Line %d: Cannot find the model for subcircuit %s.";
LAB_002d0bd8:
  sprintf(pcVar16,pcVar43,uVar38,pcVar41);
  return (Abc_Des_t *)0x0;
  while (uVar34 = uVar34 + 1, uVar18 != uVar34) {
LAB_002d1067:
    if (__s < pIVar9->vLines->pArray[uVar34]) {
      uVar33 = uVar34 & 0xffffffff;
      break;
    }
  }
LAB_002d12bc:
  pcVar41 = 
  "Line %d: Output value \"%s\" differs from the value in the first line of the table (%d).";
  __s = pbVar35;
  uVar18 = uVar38;
LAB_002d12c9:
  sprintf(pIVar9->sError,pcVar41,uVar33,__s,uVar18);
LAB_002d12d0:
  (pAVar17->field_5).pData = (void *)0x0;
  return (Abc_Des_t *)0x0;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0deb:
    if (pcVar41 < pIVar9->vLines->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0f97:
  pcVar16 = p_00->pNtk->pName;
  pcVar43 = "Line %d: Signal with name \"%s\" is not a register in the model \"%s\".";
LAB_002d11a1:
  sprintf(pIVar9->sError,pcVar43,uVar38,pcVar41,pcVar16);
  return (Abc_Des_t *)0x0;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0d31:
    if (pcVar41 < pIVar9->vLines->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0e12:
  pcVar41 = "Line %d: Wrong number (%d) of symbolic value names (should be %d).";
  uVar18 = (ulong)uVar44;
  uVar33 = CONCAT44(extraout_var,uVar10);
LAB_002d0e1c:
  sprintf(pIVar9->sError,pcVar41,uVar38,uVar18,uVar33);
  return (Abc_Des_t *)0x0;
  while (uVar33 = uVar33 + 1, uVar18 != uVar33) {
LAB_002d0d97:
    if (p_00->pName < p->vLines->pArray[uVar33]) {
      uVar38 = uVar33 & 0xffffffff;
      break;
    }
  }
LAB_002d0f79:
  sprintf(p->sError,"Line %d: Model %s has different number of latches (%d) and reset nodes (%d).",
          uVar38,p_00->pNtk->pName);
  return (Abc_Des_t *)0x0;
}

Assistant:

static Abc_Des_t * Io_MvParse( Io_MvMan_t * p )
{
    Abc_Des_t * pDesign;
    Io_MvMod_t * pMod;
    char * pLine;
    int i, k;
    // iterate through the models
    Vec_PtrForEachEntry( Io_MvMod_t *, p->vModels, pMod, i )
    { 
#ifdef IO_VERBOSE_OUTPUT
        if ( Vec_PtrSize(p->vModels) > 1 )
            printf( "Parsing model %s...\n", pMod->pNtk->pName );
#endif

        // check if there any MV lines
        if ( Vec_PtrSize(pMod->vMvs) > 0 )
            Abc_NtkStartMvVars( pMod->pNtk );
        // parse the mv lines
        Vec_PtrForEachEntry( char *, pMod->vMvs, pLine, k )
            if ( !Io_MvParseLineMv( pMod, pLine ) )
                return NULL;
        // if reset lines are used there should be the same number of them as latches
        if ( Vec_PtrSize(pMod->vResets) > 0 )
        {
            if ( Vec_PtrSize(pMod->vLatches) != Vec_PtrSize(pMod->vResets) )
            {
                sprintf( p->sError, "Line %d: Model %s has different number of latches (%d) and reset nodes (%d).", 
                    Io_MvGetLine(p, pMod->pName), Abc_NtkName(pMod->pNtk), Vec_PtrSize(pMod->vLatches), Vec_PtrSize(pMod->vResets) );
                return NULL;
            }
            // create binary latch with 1-data and 0-init
            if ( p->fUseReset ) 
                pMod->pResetLatch = Io_ReadCreateResetLatch( pMod->pNtk, p->fBlifMv );
        }
        // parse the flops
        Vec_PtrForEachEntry( char *, pMod->vFlops, pLine, k )
            if ( !Io_MvParseLineFlop( pMod, pLine ) )
                return NULL;
        // parse the latches
        Vec_PtrForEachEntry( char *, pMod->vLatches, pLine, k )
            if ( !Io_MvParseLineLatch( pMod, pLine ) )
                return NULL;
        // parse the reset lines
        if ( p->fUseReset )
            Vec_PtrForEachEntry( char *, pMod->vResets, pLine, k )
                if ( !Io_MvParseLineNamesMv( pMod, pLine, 1 ) )
                    return NULL;
        // parse the nodes
        if ( p->fBlifMv )
        {
            Vec_PtrForEachEntry( char *, pMod->vNames, pLine, k )
                if ( !Io_MvParseLineNamesMv( pMod, pLine, 0 ) )
                    return NULL;
        }
        else
        {
            Vec_PtrForEachEntry( char *, pMod->vNames, pLine, k )
                if ( !Io_MvParseLineNamesBlif( pMod, pLine ) )
                    return NULL;
            Vec_PtrForEachEntry( char *, pMod->vShorts, pLine, k )
                if ( !Io_MvParseLineShortBlif( pMod, pLine ) )
                    return NULL;
        }
        // parse the subcircuits
        Vec_PtrForEachEntry( char *, pMod->vSubckts, pLine, k )
            if ( !Io_MvParseLineSubckt( pMod, pLine ) )
                return NULL;

        // allow for blackboxes without .blackbox line
        if ( Abc_NtkLatchNum(pMod->pNtk) == 0 && Abc_NtkNodeNum(pMod->pNtk) == 0 && Abc_NtkBoxNum(pMod->pNtk) == 0 )
        {
            if ( pMod->pNtk->ntkFunc == ABC_FUNC_SOP )
            {
                Mem_FlexStop( (Mem_Flex_t *)pMod->pNtk->pManFunc, 0 );
                pMod->pNtk->pManFunc = NULL;
                pMod->pNtk->ntkFunc = ABC_FUNC_BLACKBOX;
            }
        }

        // finalize the network
        Abc_NtkFinalizeRead( pMod->pNtk );
        // read the one-hotness lines
        if ( Vec_PtrSize(pMod->vOnehots) > 0 )
        {
            Vec_Int_t * vLine; 
            Abc_Obj_t * pObj;
            // set register numbers
            Abc_NtkForEachLatch( pMod->pNtk, pObj, k )
                pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)k;
            // derive register
            pMod->pNtk->vOnehots = Vec_PtrAlloc( Vec_PtrSize(pMod->vOnehots) );
            Vec_PtrForEachEntry( char *, pMod->vOnehots, pLine, k )
            {
                vLine = Io_MvParseLineOnehot( pMod, pLine );
                if ( vLine == NULL )
                    return NULL;
                Vec_PtrPush( pMod->pNtk->vOnehots, vLine );
//                printf( "Parsed %d one-hot registers.\n", Vec_IntSize(vLine) );
            }
            // reset register numbers
            Abc_NtkForEachLatch( pMod->pNtk, pObj, k )
                pObj->pNext = NULL;
            // print the result
            printf( "Parsed %d groups of 1-hot registers: { ", Vec_PtrSize(pMod->pNtk->vOnehots) );
            Vec_PtrForEachEntry( Vec_Int_t *, pMod->pNtk->vOnehots, vLine, k )
                printf( "%d ", Vec_IntSize(vLine) );
            printf( "}\n" );
            printf( "The total number of 1-hot registers = %d. (%.2f %%)\n", 
                Vec_VecSizeSize( (Vec_Vec_t *)pMod->pNtk->vOnehots ), 
                100.0 * Vec_VecSizeSize( (Vec_Vec_t *)pMod->pNtk->vOnehots ) / Abc_NtkLatchNum(pMod->pNtk) );
            {
                extern void Abc_GenOneHotIntervals( char * pFileName, int nPis, int nRegs, Vec_Ptr_t * vOnehots );
                char * pFileName = Extra_FileNameGenericAppend( pMod->pMan->pFileName, "_1h.blif" );
                Abc_GenOneHotIntervals( pFileName, Abc_NtkPiNum(pMod->pNtk), Abc_NtkLatchNum(pMod->pNtk), pMod->pNtk->vOnehots );
                printf( "One-hotness condition is written into file \"%s\".\n", pFileName );
            }
        }
        if ( Vec_PtrSize(pMod->vFlops) )
        {
            printf( "Warning: The parser converted %d .flop lines into .latch lines\n", Vec_PtrSize(pMod->vFlops) );
            printf( "(information about set, reset, enable of the flops may be lost).\n" );
        }

    }
    if ( p->nNDnodes )
//        printf( "Warning: The parser added %d PIs to replace non-deterministic nodes.\n", p->nNDnodes );
        printf( "Warning: The parser added %d constant 0 nodes to replace non-deterministic nodes.\n", p->nNDnodes );
    // return the network
    pDesign = p->pDesign;
    p->pDesign = NULL;
    return pDesign;
}